

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::PayloadWithData<false>::dump
          (PayloadWithData<false> *this,FastString *out,int indent)

{
  String local_60;
  String local_50;
  uint local_40;
  uint32 i;
  String local_30;
  int local_1c;
  FastString *pFStack_18;
  int indent_local;
  FastString *out_local;
  PayloadWithData<false> *this_local;
  
  local_1c = indent;
  pFStack_18 = out;
  out_local = (FastString *)this;
  MQTTStringPrintf((char *)&local_30,"%*sPayload (length: %u)",(ulong)(uint)indent,"",
                   (ulong)this->size);
  Bstrlib::String::operator+=(pFStack_18,&local_30);
  Bstrlib::String::~String(&local_30);
  for (local_40 = 0; local_40 < this->size; local_40 = local_40 + 1) {
    if ((local_40 & 0xf) == 0) {
      MQTTStringPrintf((char *)&local_50,"\n%*s",(ulong)(local_1c + 2),"");
      Bstrlib::String::operator+=(pFStack_18,&local_50);
      Bstrlib::String::~String(&local_50);
    }
    MQTTStringPrintf((char *)&local_60,"%02X ",(ulong)this->data[local_40]);
    Bstrlib::String::operator+=(pFStack_18,&local_60);
    Bstrlib::String::~String(&local_60);
  }
  Bstrlib::String::operator+=(pFStack_18,"\n");
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sPayload (length: %u)", (int)indent, "", size);
                    for (uint32 i = 0; i < size; i++)
                    {
                        if (!(i%16)) out+= MQTTStringPrintf("\n%*s", (int)indent + 2, "");
                        out += MQTTStringPrintf("%02X ", data[i]);
                    }
                    out += "\n";
                 }